

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O2

void __thiscall FlowGraph::RemoveUnreachableBlocks(FlowGraph *this)

{
  BasicBlock **ppBVar1;
  undefined1 *puVar2;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *pSVar3;
  code *pcVar4;
  bool bVar5;
  undefined4 *puVar6;
  Type *ppFVar7;
  BasicBlock *pBVar8;
  BasicBlock *pBVar9;
  Iterator local_40;
  
  if (this->blockList == (BasicBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0x963,"(this->blockList)","this->blockList");
    if (!bVar5) {
LAB_003f74cd:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar6 = 0;
  }
  ppBVar1 = &this->blockList;
  pBVar8 = (BasicBlock *)ppBVar1;
  while (pBVar8 = pBVar8->next, pBVar8 != (BasicBlock *)0x0) {
    if ((*(ushort *)&pBVar8->field_0x18 & 1) == 0) {
      *(ushort *)&pBVar8->field_0x18 = *(ushort *)&pBVar8->field_0x18 & 0xffde;
    }
  }
  *(ushort *)&(*ppBVar1)->field_0x18 = *(ushort *)&(*ppBVar1)->field_0x18 | 0x20;
  pBVar8 = *ppBVar1;
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  do {
    while( true ) {
      do {
        pBVar9 = pBVar8;
        if (pBVar9 == (BasicBlock *)0x0) {
          return;
        }
        pBVar8 = pBVar9->next;
      } while ((*(ushort *)&pBVar9->field_0x18 & 1) != 0);
      if ((*(ushort *)&pBVar9->field_0x18 & 0x20) != 0) break;
      RemoveBlock(this,pBVar9,(GlobOpt *)0x0,false);
    }
    local_40.list =
         &(pBVar9->succList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
    local_40.current = &(local_40.list)->super_SListNodeBase<Memory::ArenaAllocator>;
    while( true ) {
      if ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_40.current ==
          (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar5) goto LAB_003f74cd;
        *puVar6 = 0;
      }
      pSVar3 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
               (((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                &(local_40.current)->next)->super_SListNodeBase<Memory::ArenaAllocator>).next;
      if (pSVar3 == local_40.list) break;
      local_40.current = (NodeBase *)pSVar3;
      ppFVar7 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data(&local_40);
      pBVar9 = (*ppFVar7)->succBlock;
      if (pBVar9 == (BasicBlock *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                           ,0x971,"(succ)","succ");
        if (!bVar5) goto LAB_003f74cd;
        *puVar6 = 0;
      }
      puVar2 = &pBVar9->field_0x18;
      *puVar2 = *puVar2 | 0x20;
    }
  } while( true );
}

Assistant:

void
FlowGraph::RemoveUnreachableBlocks()
{
    AnalysisAssert(this->blockList);

    FOREACH_BLOCK(block, this)
    {
        block->isVisited = false;
    }
    NEXT_BLOCK;

    this->blockList->isVisited = true;

    FOREACH_BLOCK_EDITING(block, this)
    {
        if (block->isVisited)
        {
            FOREACH_SUCCESSOR_BLOCK(succ, block)
            {
                succ->isVisited = true;
            } NEXT_SUCCESSOR_BLOCK;
        }
        else
        {
            this->RemoveBlock(block);
        }
    }
    NEXT_BLOCK_EDITING;
}